

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializePayload0.cpp
# Opt level: O0

FormatError __thiscall
trackerboy::deserializePayload0TU::LegacyInstHandler::processIn
          (LegacyInstHandler *this,Module *mod,InputBlock *block,size_t index)

{
  InstrumentTable *this_00;
  Instrument *inst_00;
  Instrument *inst;
  size_t id;
  InstrumentTable *itable;
  size_t index_local;
  InputBlock *block_local;
  Module *mod_local;
  LegacyInstHandler *this_local;
  
  this_00 = Module::instrumentTable(mod);
  for (inst = (Instrument *)0x0; inst != (Instrument *)0x40;
      inst = (Instrument *)&(inst->super_Named).mName.field_0x1) {
    inst_00 = Table<trackerboy::Instrument>::operator[](this_00,(int)inst);
    if (inst_00 != (Instrument *)0x0) {
      InstHandler::deserializeInstrument(block,inst_00);
    }
  }
  return none;
}

Assistant:

FormatError processIn(Module &mod, InputBlock &block, size_t index) {
        (void)index;

        auto &itable = mod.instrumentTable();
        for (size_t id = 0; id != InstrumentTable::MAX_SIZE; ++id) {
            auto inst = itable[id];
            if (inst) {
                // same format as major 1
                InstHandler::deserializeInstrument(block, *inst);
            }
        }

        return FormatError::none;
    }